

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate1<double>::apply
          (QGate1<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,int offset
          )

{
  double dVar1;
  SquareMatrix<double> *rhs;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  _Head_base<0UL,_double_*,_false> _Var5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  int64_t k;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  double dVar22;
  SquareMatrix<double> mat1;
  SquareMatrix<double> local_70;
  SquareMatrix<double> *local_60;
  SquareMatrix<double> local_58;
  SquareMatrix<double> local_48;
  long local_38;
  
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  local_60 = matrix;
  iVar2 = (*(this->super_QObject<double>)._vptr_QObject[3])();
  uVar3 = iVar2 + offset;
  if (nbQubits <= (int)uVar3) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  (*(this->super_QObject<double>)._vptr_QObject[7])(&local_70);
  rhs = local_60;
  if ((op != NoTrans) && (1 < local_70.size_)) {
    pdVar4 = (double *)
             ((long)local_70.data_._M_t.
                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + local_70.size_ * 8);
    _Var5._M_head_impl = (double *)local_70.data_;
    lVar12 = 0;
    do {
      lVar15 = 1;
      pdVar7 = pdVar4;
      do {
        dVar22 = _Var5._M_head_impl[lVar15];
        _Var5._M_head_impl[lVar15] = *pdVar7;
        *pdVar7 = dVar22;
        lVar13 = lVar12 + lVar15;
        lVar15 = lVar15 + 1;
        pdVar7 = pdVar7 + local_70.size_;
      } while (lVar13 + 1 < local_70.size_);
      pdVar4 = pdVar4 + local_70.size_ + 1;
      _Var5._M_head_impl = _Var5._M_head_impl + local_70.size_ + 1;
      bVar21 = lVar12 != local_70.size_ + -2;
      lVar12 = lVar12 + 1;
    } while (bVar21);
  }
  if (side == Left) {
    if (nbQubits == 1) {
      lVar12 = local_60->size_;
      if (lVar12 != local_70.size_) {
        __assert_fail("size_ == rhs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                      ,0xb0,
                      "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator*=(const SquareMatrix<T> &) [T = double]"
                     );
      }
      if (lVar12 == 0) {
        __assert_fail("size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                      ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = double]");
      }
      uVar20 = -(ulong)((ulong)(lVar12 * lVar12) >> 0x3d != 0) | lVar12 * lVar12 * 8;
      pdVar4 = (double *)operator_new__(uVar20);
      memset(pdVar4,0,uVar20);
      if (0 < lVar12) {
        pdVar7 = (rhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        lVar15 = 0;
        _Var5._M_head_impl =
             (double *)
             local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
        do {
          lVar13 = 0;
          pdVar11 = pdVar7;
          do {
            dVar22 = pdVar4[lVar15 * lVar12 + lVar13];
            lVar16 = 0;
            pdVar14 = pdVar11;
            do {
              dVar22 = dVar22 + *pdVar14 * _Var5._M_head_impl[lVar16];
              pdVar4[lVar15 * lVar12 + lVar13] = dVar22;
              lVar16 = lVar16 + 1;
              pdVar14 = pdVar14 + lVar12;
            } while (lVar12 != lVar16);
            lVar13 = lVar13 + 1;
            pdVar11 = pdVar11 + 1;
          } while (lVar13 != lVar12);
          lVar15 = lVar15 + 1;
          _Var5._M_head_impl = _Var5._M_head_impl + local_70.size_;
        } while (lVar15 != lVar12);
      }
      pdVar7 = (rhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      (rhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar4;
      if (pdVar7 != (double *)0x0) {
        operator_delete__(pdVar7);
      }
    }
    else {
      lVar12 = local_60->size_;
      if (0 < lVar12) {
        lVar13 = (long)(1 << ((byte)(~uVar3 + nbQubits) & 0x1f));
        uVar10 = 1 << ((byte)uVar3 & 0x1f);
        lVar15 = 1;
        if (1 < lVar13) {
          lVar15 = lVar13;
        }
        if ((int)uVar10 < 2) {
          uVar10 = 1;
        }
        local_38 = lVar13 * lVar12 * 8;
        lVar16 = 0;
        lVar17 = 0;
        do {
          if (uVar3 != 0x1f) {
            pdVar4 = (local_60->data_)._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl;
            uVar20 = 0;
            do {
              lVar6 = lVar15;
              pdVar7 = pdVar4;
              if (~uVar3 + nbQubits != 0x1f) {
                do {
                  dVar22 = *(double *)((long)pdVar7 + lVar16);
                  dVar1 = *(double *)((long)pdVar7 + local_38 + lVar16);
                  *(double *)((long)pdVar7 + lVar16) =
                       *(double *)
                        local_70.data_._M_t.
                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar22 +
                       *(double *)
                        ((long)local_70.data_._M_t.
                               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                               super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) * dVar1;
                  *(double *)((long)pdVar7 + local_38 + lVar16) =
                       dVar22 * *(double *)
                                 ((long)local_70.data_._M_t.
                                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                        .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                 local_70.size_ * 8) +
                       dVar1 * ((double *)
                               ((long)local_70.data_._M_t.
                                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                      .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8))
                               [local_70.size_];
                  pdVar7 = pdVar7 + lVar12;
                  lVar6 = lVar6 + -1;
                } while (lVar6 != 0);
              }
              uVar20 = uVar20 + 1;
              pdVar4 = pdVar4 + lVar13 * lVar12 * 2;
            } while (uVar20 != uVar10);
          }
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 8;
        } while (lVar17 != lVar12);
      }
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<double>::SquareMatrix(&local_58,&local_70);
    dense::operator*((dense *)&local_48,&local_58,rhs);
    dense::SquareMatrix<double>::operator=(rhs,&local_48);
    if (local_48.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      operator_delete__((void *)local_48.data_._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
    local_48.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
         (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
    if ((tuple<double_*,_std::default_delete<double[]>_>)
        local_58.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0
       ) {
      operator_delete__((void *)local_58.data_._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
    local_58.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
         (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  }
  else {
    lVar12 = local_60->size_;
    if (0 < lVar12) {
      lVar13 = (long)(1 << ((byte)(~uVar3 + nbQubits) & 0x1f));
      uVar10 = 1 << ((byte)uVar3 & 0x1f);
      lVar15 = 1;
      if (1 < lVar13) {
        lVar15 = lVar13;
      }
      uVar20 = (ulong)uVar10;
      if ((int)uVar10 < 2) {
        uVar20 = 1;
      }
      lVar16 = lVar13 * 8;
      lVar17 = 0;
      lVar6 = 0;
      do {
        if (uVar3 != 0x1f) {
          pdVar4 = (local_60->data_)._M_t.
                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
          lVar18 = (long)pdVar4 + lVar16;
          lVar19 = (long)pdVar4 + lVar17;
          uVar8 = 0;
          do {
            if (~uVar3 + nbQubits != 0x1f) {
              lVar9 = 0;
              do {
                dVar22 = *(double *)(lVar19 + lVar9 * 8);
                dVar1 = *(double *)(lVar18 + lVar9 * 8);
                *(double *)(lVar19 + lVar9 * 8) =
                     *(double *)
                      local_70.data_._M_t.
                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                      super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar22 +
                     *(double *)
                      ((long)local_70.data_._M_t.
                             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                             super__Head_base<0UL,_double_*,_false>._M_head_impl +
                      local_70.size_ * 8) * dVar1;
                *(double *)(lVar18 + lVar9 * 8) =
                     dVar22 * *(double *)
                               ((long)local_70.data_._M_t.
                                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                      .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) +
                     dVar1 * ((double *)
                             ((long)local_70.data_._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8))
                             [local_70.size_];
                lVar9 = lVar9 + 1;
              } while (lVar15 != lVar9);
            }
            uVar8 = uVar8 + 1;
            lVar18 = lVar18 + lVar13 * 0x10;
            lVar19 = lVar19 + lVar13 * 0x10;
          } while (uVar8 != uVar20);
        }
        lVar6 = lVar6 + 1;
        lVar16 = lVar16 + lVar12 * 8;
        lVar17 = lVar17 + lVar12 * 8;
      } while (lVar6 != lVar12);
    }
  }
  if ((_Head_base<0UL,_double_*,_false>)
      local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_70.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }